

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O0

void __thiscall tensor_t<float>::tensor_t(tensor_t<float> *this,int _x,int _y,int _z)

{
  vector<float,_std::allocator<float>_> *__x;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffb8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  allocator_type local_31 [29];
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x103e7b);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  __x = (vector<float,_std::allocator<float>_> *)(long)(local_c * local_10 * local_14);
  __a = local_31;
  std::allocator<float>::allocator((allocator<float> *)0x103ebd);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)__a,__x);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::allocator<float>::~allocator((allocator<float> *)0x103ef5);
  *(int *)(in_RDI + 0x18) = local_c;
  *(int *)(in_RDI + 0x1c) = local_10;
  *(int *)(in_RDI + 0x20) = local_14;
  return;
}

Assistant:

tensor_t(int _x, int _y, int _z) {
    data = std::vector<T>(static_cast<unsigned long>(_x * _y * _z));
    size.x = _x;
    size.y = _y;
    size.z = _z;
  }